

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void opj_v4dwt_interleave_h
               (opj_v4dwt_t *dwt,OPJ_FLOAT32 *a,OPJ_UINT32 width,OPJ_UINT32 remaining_height)

{
  int iVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  uint uVar4;
  opj_v4_t *poVar5;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  OPJ_UINT32 OVar11;
  opj_v4_t *poVar12;
  OPJ_UINT32 *pOVar13;
  uint uVar14;
  
  poVar5 = dwt->wavelet;
  iVar1 = dwt->cas;
  iVar2 = dwt->sn;
  OVar3 = dwt->win_h_x1;
  pOVar13 = &dwt->win_l_x0;
  OVar11 = dwt->win_l_x1;
  bVar7 = true;
  lVar9 = (long)iVar1;
  do {
    bVar10 = bVar7;
    poVar12 = poVar5 + lVar9;
    uVar4 = *pOVar13;
    uVar8 = (ulong)uVar4;
    if (((((width & 0xf) == 0) && (3 < remaining_height)) && (((ulong)a & 0xf) == 0)) &&
       (((ulong)poVar12 & 0xf) == 0)) {
      if (uVar4 < OVar11) {
        uVar14 = uVar4 * 8;
        lVar9 = 0;
        do {
          poVar12->f[uVar14] = a[uVar8 + lVar9];
          iVar6 = (int)lVar9;
          poVar12->f[uVar14 + 1] = a[width + uVar4 + iVar6];
          poVar12->f[uVar14 + 2] = a[width * 2 + uVar4 + iVar6];
          poVar12->f[uVar14 + 3] = a[width * 3 + uVar4 + iVar6];
          lVar9 = lVar9 + 1;
          uVar14 = uVar14 + 8;
        } while (OVar11 - uVar8 != lVar9);
      }
    }
    else if (uVar4 < OVar11) {
      uVar14 = uVar4 * 8;
      lVar9 = 0;
      do {
        poVar12->f[uVar14] = a[uVar8 + lVar9];
        if (remaining_height != 1) {
          iVar6 = (int)lVar9;
          poVar12->f[uVar14 + 1] = a[width + uVar4 + iVar6];
          if ((remaining_height != 2) &&
             (poVar12->f[uVar14 + 2] = a[iVar6 + width * 2 + uVar4], remaining_height != 3)) {
            poVar12->f[uVar14 + 3] = a[width * 3 + uVar4 + iVar6];
          }
        }
        lVar9 = lVar9 + 1;
        uVar14 = uVar14 + 8;
      } while (OVar11 - uVar8 != lVar9);
    }
    a = a + iVar2;
    pOVar13 = &dwt->win_h_x0;
    OVar11 = OVar3;
    bVar7 = false;
    lVar9 = 1 - (long)iVar1;
  } while (bVar10);
  return;
}

Assistant:

static void opj_v4dwt_interleave_h(opj_v4dwt_t* OPJ_RESTRICT dwt,
                                   OPJ_FLOAT32* OPJ_RESTRICT a,
                                   OPJ_UINT32 width,
                                   OPJ_UINT32 remaining_height)
{
    OPJ_FLOAT32* OPJ_RESTRICT bi = (OPJ_FLOAT32*)(dwt->wavelet + dwt->cas);
    OPJ_UINT32 i, k;
    OPJ_UINT32 x0 = dwt->win_l_x0;
    OPJ_UINT32 x1 = dwt->win_l_x1;

    for (k = 0; k < 2; ++k) {
        if (remaining_height >= 4 && ((OPJ_SIZE_T) a & 0x0f) == 0 &&
                ((OPJ_SIZE_T) bi & 0x0f) == 0 && (width & 0x0f) == 0) {
            /* Fast code path */
            for (i = x0; i < x1; ++i) {
                OPJ_UINT32 j = i;
                bi[i * 8    ] = a[j];
                j += width;
                bi[i * 8 + 1] = a[j];
                j += width;
                bi[i * 8 + 2] = a[j];
                j += width;
                bi[i * 8 + 3] = a[j];
            }
        } else {
            /* Slow code path */
            for (i = x0; i < x1; ++i) {
                OPJ_UINT32 j = i;
                bi[i * 8    ] = a[j];
                j += width;
                if (remaining_height == 1) {
                    continue;
                }
                bi[i * 8 + 1] = a[j];
                j += width;
                if (remaining_height == 2) {
                    continue;
                }
                bi[i * 8 + 2] = a[j];
                j += width;
                if (remaining_height == 3) {
                    continue;
                }
                bi[i * 8 + 3] = a[j]; /* This one*/
            }
        }

        bi = (OPJ_FLOAT32*)(dwt->wavelet + 1 - dwt->cas);
        a += dwt->sn;
        x0 = dwt->win_h_x0;
        x1 = dwt->win_h_x1;
    }
}